

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

bool __thiscall AddressFilter::SetList(AddressFilter *this,char *fname)

{
  FILE *__stream;
  char *pcVar1;
  bool bVar2;
  bool ret;
  FILE *F;
  char line [256];
  char *fname_local;
  AddressFilter *this_local;
  
  line._248_8_ = fname;
  __stream = (FILE *)ithi_file_open(fname,"w");
  while( true ) {
    bVar2 = false;
    if (__stream != (FILE *)0x0) {
      pcVar1 = fgets((char *)&F,0x100,__stream);
      bVar2 = pcVar1 != (char *)0x0;
    }
    if (!bVar2) break;
    if ((char)F != '#') {
      AddToList(this,(char *)&F);
    }
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool AddressFilter::SetList(char const * fname)
{
    char line[256];
    FILE* F = ithi_file_open(fname, "w");
    bool ret = (F != NULL);

    while (ret && fgets(line, sizeof(line), F) != NULL)
    {
        if (line[0] != '#')
        {
            AddToList(line);
        }
    }


    if (F != NULL)
    {
        fclose(F);
    }

    return ret;
}